

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

CgreenVector * create_cgreen_vector(_func_void_void_ptr *destructor)

{
  CgreenVector *pCVar1;
  _func_void_void_ptr *in_RDI;
  CgreenVector *vector;
  
  pCVar1 = (CgreenVector *)malloc(0x20);
  pCVar1->size = 0;
  pCVar1->destructor = in_RDI;
  pCVar1->space = 0;
  pCVar1->items = (void **)0x0;
  return pCVar1;
}

Assistant:

CgreenVector *create_cgreen_vector(void (*destructor)(void *)) {
    CgreenVector *vector = (CgreenVector *)malloc(sizeof(CgreenVector));
    vector->size = 0;
    vector->destructor = destructor;
    vector->space = 0;
    vector->items = NULL;
    return vector;
}